

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_amr_transfer.cpp
# Opt level: O2

void Omega_h::amr::transfer_inherit<signed_char>
               (Mesh *old_mesh,Mesh *new_mesh,Few<Omega_h::Read<int>,_4> *prods2new_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2old_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2new_ents,string *name)

{
  ulong *puVar1;
  Int ncomps;
  Int IVar2;
  LO size_in;
  Tag<signed_char> *this;
  Write<signed_char> *this_00;
  long lVar3;
  long lVar4;
  ulong uVar5;
  allocator local_1e9;
  Mesh *local_1e8;
  Mesh *local_1e0;
  Few<Omega_h::Read<int>,_4> *local_1d8;
  string *local_1d0;
  Read<int> *local_1c8;
  Read<int> *local_1c0;
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<signed_char> local_198;
  Write<signed_char> local_188;
  Read<signed_char> same_data;
  Few<Omega_h::Write<signed_char>,_4> new_data;
  Write<signed_char> local_118;
  Write<signed_char> local_108;
  Write<signed_char> local_f8;
  Omega_h local_e8 [16];
  Read<signed_char> old_data;
  Parents local_90;
  Few<Omega_h::Write<signed_char>,_4> local_70;
  
  new_data.array_[3].shared_alloc_.alloc = (Alloc *)0x0;
  new_data.array_[3].shared_alloc_.direct_ptr = (void *)0x0;
  new_data.array_[2].shared_alloc_.alloc = (Alloc *)0x0;
  new_data.array_[2].shared_alloc_.direct_ptr = (void *)0x0;
  new_data.array_[1].shared_alloc_.alloc = (Alloc *)0x0;
  new_data.array_[1].shared_alloc_.direct_ptr = (void *)0x0;
  new_data.array_[0].shared_alloc_.alloc = (Alloc *)0x0;
  new_data.array_[0].shared_alloc_.direct_ptr = (void *)0x0;
  local_1e8 = new_mesh;
  local_1e0 = old_mesh;
  local_1d8 = prods2new_ents;
  local_1d0 = name;
  local_1c8 = same_ents2new_ents->array_;
  local_1c0 = same_ents2old_ents->array_;
  this = Omega_h::Mesh::get_tag<signed_char>(old_mesh,0,name);
  ncomps = TagBase::ncomps(&this->super_TagBase);
  this_00 = new_data.array_;
  uVar5 = 0;
  while( true ) {
    IVar2 = Omega_h::Mesh::dim(local_1e0);
    if ((long)IVar2 < (long)uVar5) break;
    size_in = Omega_h::Mesh::nents(local_1e8,(Int)uVar5);
    std::__cxx11::string::string((string *)&old_data,"",&local_1e9);
    Write<signed_char>::Write((Write<signed_char> *)&same_data,size_in,-1,(string *)&old_data);
    Write<signed_char>::operator=(this_00,(Write<signed_char> *)&same_data);
    Write<signed_char>::~Write((Write<signed_char> *)&same_data);
    std::__cxx11::string::~string((string *)&old_data);
    Omega_h::Mesh::get_array<signed_char>
              ((Mesh *)&old_data,(Int)local_1e0,(string *)(uVar5 & 0xffffffff));
    Write<int>::Write(&local_1b8,&local_1c0->write_);
    Write<signed_char>::Write(&local_188,&old_data.write_);
    unmap<signed_char>(local_e8,(LOs *)&local_1b8,(Read<signed_char> *)&local_188,ncomps);
    read<signed_char>((Omega_h *)&same_data,(Write<signed_char> *)local_e8);
    Write<signed_char>::~Write((Write<signed_char> *)local_e8);
    Write<signed_char>::~Write(&local_188);
    Write<int>::~Write(&local_1b8);
    Write<signed_char>::Write(&local_198,(Write<signed_char> *)&same_data);
    Write<int>::Write(&local_1a8,&local_1c8->write_);
    Write<signed_char>::Write(&local_f8,this_00);
    map_into<signed_char>((Read<signed_char> *)&local_198,(LOs *)&local_1a8,&local_f8,ncomps);
    Write<signed_char>::~Write(&local_f8);
    Write<int>::~Write(&local_1a8);
    Write<signed_char>::~Write(&local_198);
    Write<signed_char>::~Write((Write<signed_char> *)&same_data);
    Write<signed_char>::~Write(&old_data.write_);
    uVar5 = uVar5 + 1;
    local_1c8 = local_1c8 + 1;
    local_1c0 = local_1c0 + 1;
    this_00 = this_00 + 1;
  }
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    IVar2 = Omega_h::Mesh::dim(local_1e0);
    if (IVar2 < lVar4) break;
    Omega_h::Mesh::ask_parents((Parents *)&same_data,local_1e8,(Int)lVar4);
    Few<Omega_h::Read<int>,_4>::Few((Few<Omega_h::Read<int>,_4> *)&old_data,local_1d8);
    Parents::Parents(&local_90,(Parents *)&same_data);
    Few<Omega_h::Write<signed_char>,_4>::Few(&local_70,&new_data);
    puVar1 = *(ulong **)((long)&local_1d8->array_[0].write_.shared_alloc_.alloc + lVar3);
    if (((ulong)puVar1 & 1) == 0) {
      uVar5 = *puVar1;
    }
    else {
      uVar5 = (ulong)puVar1 >> 3;
    }
    parallel_for<Omega_h::amr::transfer_inherit<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)::_lambda(int)_1_&>
              ((LO)(uVar5 >> 2),(type *)&old_data);
    Write<signed_char>::Write
              (&local_118,
               (Write<signed_char> *)((long)&new_data.array_[0].shared_alloc_.alloc + lVar3));
    Read<signed_char>::Read((Read<signed_char> *)&local_108,&local_118);
    Omega_h::Mesh::add_tag<signed_char>
              (local_1e8,(Int)lVar4,local_1d0,ncomps,(Read<signed_char> *)&local_108,true);
    Write<signed_char>::~Write(&local_108);
    Write<signed_char>::~Write(&local_118);
    transfer_inherit<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)
    ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)&old_data);
    Parents::~Parents((Parents *)&same_data);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  Few<Omega_h::Write<signed_char>,_4>::~Few(&new_data);
  return;
}

Assistant:

void transfer_inherit(Mesh* old_mesh, Mesh* new_mesh,
    Few<LOs, 4> const prods2new_ents, Few<LOs, 4> same_ents2old_ents,
    Few<LOs, 4> same_ents2new_ents, std::string const& name) {
  Few<Write<T>, 4> new_data;
  auto ncomps = old_mesh->get_tag<T>(0, name)->ncomps();
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    new_data[prod_dim] = Write<T>(new_mesh->nents(prod_dim), -1);
    auto old_data = old_mesh->get_array<T>(prod_dim, name);
    auto same_data =
        read(unmap(same_ents2old_ents[prod_dim], old_data, ncomps));
    map_into(
        same_data, same_ents2new_ents[prod_dim], new_data[prod_dim], ncomps);
  }
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    auto parents = new_mesh->ask_parents(prod_dim);
    auto f = OMEGA_H_LAMBDA(LO prod) {
      auto prod_ent = prods2new_ents[prod_dim][prod];
      auto parent_ent = parents.parent_idx[prod_ent];
      auto code = parents.codes[prod_ent];
      auto parent_dim = code_parent_dim(code);
      new_data[prod_dim][prod_ent] = new_data[parent_dim][parent_ent];
    };
    parallel_for(prods2new_ents[prod_dim].size(), f);
    new_mesh->add_tag(
        prod_dim, name, ncomps, Read<T>(new_data[prod_dim]), true);
  }
}